

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void duckdb::
     TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  long lVar1;
  long extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  ParquetUUIDTargetType target_value_00;
  hugeint_t input;
  ParquetUUIDTargetType target_value;
  data_t local_38 [16];
  
  lVar3 = chunk_end - chunk_start;
  if (chunk_start <= chunk_end && lVar3 != 0) {
    lVar1 = chunk_start * 0x10;
    p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&(col->type).id_ + lVar1);
    do {
      input.upper = lVar1;
      input.lower = (uint64_t)p_Var2->_M_pi;
      local_38 = (data_t  [16])
                 ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                           ((ParquetUUIDOperator *)
                            ((__shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2> *)
                            (p_Var2 + -1))->_M_ptr,input);
      target_value_00.bytes._0_8_ = local_38._8_8_;
      target_value_00.bytes[8] = (char)chunk_end;
      target_value_00.bytes[9] = (char)(chunk_end >> 8);
      target_value_00.bytes[10] = (char)(chunk_end >> 0x10);
      target_value_00.bytes[0xb] = (char)(chunk_end >> 0x18);
      target_value_00.bytes[0xc] = (char)(chunk_end >> 0x20);
      target_value_00.bytes[0xd] = (char)(chunk_end >> 0x28);
      target_value_00.bytes[0xe] = (char)(chunk_end >> 0x30);
      target_value_00.bytes[0xf] = (char)(chunk_end >> 0x38);
      ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                ((ParquetUUIDOperator *)stats,local_38._0_8_,target_value_00);
      (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
                (mask,local_38,0x10);
      p_Var2 = p_Var2 + 2;
      lVar3 = lVar3 + -1;
      lVar1 = extraout_RDX;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}